

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::SetIndexAction_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  Var instance;
  RecyclableObject *pRVar2;
  Var aValue;
  undefined1 *aValue_00;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == SetIndexActionTag) {
    instance = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (instance != (Var)0x0) {
      BVar1 = Js::JavascriptOperators::IsObject(instance);
      if (BVar1 != 0) {
        pRVar2 = Js::VarTo<Js::RecyclableObject>(instance);
        if ((((((pRVar2->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          instance = Js::CrossSite::MarshalVar(scriptContext,pRVar2,false);
        }
        aValue = InflateVarInReplay(executeContext,*(TTDVar *)(evt + 2));
        if (aValue != (Var)0x0) {
          if ((ulong)aValue >> 0x30 == 0) {
            pRVar2 = Js::VarTo<Js::RecyclableObject>(aValue);
            if ((((((pRVar2->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr != scriptContext) {
              aValue = Js::CrossSite::MarshalVar(scriptContext,pRVar2,false);
            }
          }
          aValue_00 = (undefined1 *)InflateVarInReplay(executeContext,(TTDVar)evt[2].EventTimeStamp)
          ;
          if (aValue_00 != (undefined1 *)0x0) {
            if (aValue_00 < &DAT_1000000000000) {
              pRVar2 = Js::VarTo<Js::RecyclableObject>(aValue_00);
              if ((((((pRVar2->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                  scriptContext.ptr != scriptContext) {
                aValue_00 = (undefined1 *)Js::CrossSite::MarshalVar(scriptContext,pRVar2,false);
              }
            }
            Js::JavascriptOperators::OP_SetElementI
                      (instance,aValue,aValue_00,scriptContext,PropertyOperation_None);
            return;
          }
        }
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void SetIndexAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTTrippleVarArgumentAction* action = GetInlineEventDataAs<JsRTTrippleVarArgumentAction, EventKind::SetIndexActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);
            Js::Var index = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(index, ctx);
            Js::Var value = InflateVarInReplay(executeContext, GetVarItem_2(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(value, ctx);

            Js::JavascriptOperators::OP_SetElementI(var, index, value, ctx);
        }